

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preset.cpp
# Opt level: O0

void __thiscall sf2cute::SFPreset::AddZone(SFPreset *this,SFPresetZone *zone)

{
  bool bVar1;
  SFPreset *pSVar2;
  invalid_argument *this_00;
  SoundFont *this_01;
  undefined1 local_40 [8];
  SFPresetZone *local_18;
  SFPresetZone *zone_local;
  SFPreset *this_local;
  
  local_18 = zone;
  zone_local = (SFPresetZone *)this;
  bVar1 = SFPresetZone::has_parent_preset(zone);
  if (bVar1) {
    pSVar2 = SFPresetZone::parent_preset(zone);
    if (pSVar2 != this) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (this_00,"Preset zone has already been owned by another preset.");
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
  }
  else {
    SFPresetZone::set_parent_preset(zone,this);
    bVar1 = has_parent_file(this);
    if ((bVar1) && (bVar1 = SFPresetZone::has_instrument(zone), bVar1)) {
      this_01 = parent_file(this);
      SFPresetZone::instrument((SFPresetZone *)&stack0xffffffffffffffc8);
      SoundFont::AddInstrument
                (this_01,(shared_ptr<sf2cute::SFInstrument> *)&stack0xffffffffffffffc8);
      std::shared_ptr<sf2cute::SFInstrument>::~shared_ptr
                ((shared_ptr<sf2cute::SFInstrument> *)&stack0xffffffffffffffc8);
    }
    std::make_unique<sf2cute::SFPresetZone,sf2cute::SFPresetZone>((SFPresetZone *)local_40);
    std::
    vector<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>
    ::push_back(&this->zones_,(value_type *)local_40);
    std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>::~unique_ptr
              ((unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_> *)
               local_40);
  }
  return;
}

Assistant:

void SFPreset::AddZone(SFPresetZone zone) {
  // Check the parent preset of the zone.
  if (zone.has_parent_preset()) {
    if (&zone.parent_preset() == this) {
      // If the zone is already be owned by this preset, do nothing.
      return;
    }
    else {
      // Otherwise raise an error. A zone cannot be shared by two parents.
      throw std::invalid_argument("Preset zone has already been owned by another preset.");
    }
  }

  // Set this preset to the parent instrument of the zone.
  zone.set_parent_preset(*this);

  // If the zone has an orphan instrument, add it to the parent file.
  if (has_parent_file()) {
    if (zone.has_instrument()) {
      parent_file().AddInstrument(zone.instrument());
    }
  }

  // Add the zone to the list.
  zones_.push_back(std::make_unique<SFPresetZone>(std::move(zone)));
}